

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O3

int ConnectLIRMIA3(LIRMIA3 *pLIRMIA3,char *szCfgFilePath)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  FILE *__stream;
  char *pcVar7;
  char line [256];
  byte local_138;
  char local_137;
  
  memset(pLIRMIA3->szCfgFilePath,0,0x100);
  sprintf(pLIRMIA3->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar5 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar5 != 0) {
    memset(&local_138,0,0x100);
    memset(pLIRMIA3->szDevPath + 5,0,0xfb);
    builtin_strncpy(pLIRMIA3->szDevPath,"COM1",5);
    pLIRMIA3->BaudRate = 0x1c200;
    pLIRMIA3->timeout = 1000;
    pLIRMIA3->threadperiod = 0x32;
    pLIRMIA3->bSaveRawData = 1;
    lVar6 = -0x10;
    do {
      *(undefined8 *)((long)pLIRMIA3->MidPWs + lVar6) = 0x3e8000003e8;
      *(undefined8 *)((long)pLIRMIA3->MaxPWs + lVar6) = 0x5dc000005dc;
      *(undefined8 *)((long)pLIRMIA3->InitPWs + lVar6) = 0x7d0000007d0;
      *(undefined8 *)((long)pLIRMIA3->ThresholdPWs + lVar6) = 0x5dc000005dc;
      *(undefined8 *)((long)pLIRMIA3->CoefPWs + lVar6) = 0;
      puVar1 = (undefined8 *)((long)pLIRMIA3->bProportionalPWs + lVar6 * 2);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0x3ff0000000000000;
      *(undefined8 *)((long)pLIRMIA3->bProportionalPWs + lVar6 + 0x10) = 0x100000001;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0);
    pLIRMIA3->rightthrusterchan = 3;
    pLIRMIA3->leftthrusterchan = 2;
    pLIRMIA3->frontthrusterchan = 0;
    pLIRMIA3->rearthrusterchan = 1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar7 = "Configuration file not found.";
    }
    else {
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c620e;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c6226;
        }
        if (local_138 != 0x23) break;
LAB_001c620e:
        if (pcVar7 == (char *)0x0) goto LAB_001c622b;
      }
      if (local_138 == 0x24) goto LAB_001c622b;
LAB_001c6226:
      if (pcVar7 == (char *)0x0) {
LAB_001c622b:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%255s",pLIRMIA3->szDevPath);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c629a;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c62a6;
        }
        if (local_138 != 0x23) break;
LAB_001c629a:
        if (pcVar7 == (char *)0x0) goto LAB_001c62ab;
      }
      if (local_138 == 0x24) goto LAB_001c62ab;
LAB_001c62a6:
      if (pcVar7 == (char *)0x0) {
LAB_001c62ab:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->BaudRate);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c631c;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c6328;
        }
        if (local_138 != 0x23) break;
LAB_001c631c:
        if (pcVar7 == (char *)0x0) goto LAB_001c632d;
      }
      if (local_138 == 0x24) goto LAB_001c632d;
LAB_001c6328:
      if (pcVar7 == (char *)0x0) {
LAB_001c632d:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->timeout);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c639e;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c63aa;
        }
        if (local_138 != 0x23) break;
LAB_001c639e:
        if (pcVar7 == (char *)0x0) goto LAB_001c63af;
      }
      if (local_138 == 0x24) goto LAB_001c63af;
LAB_001c63aa:
      if (pcVar7 == (char *)0x0) {
LAB_001c63af:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->threadperiod);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c6420;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c642c;
        }
        if (local_138 != 0x23) break;
LAB_001c6420:
        if (pcVar7 == (char *)0x0) goto LAB_001c6431;
      }
      if (local_138 == 0x24) goto LAB_001c6431;
LAB_001c642c:
      if (pcVar7 == (char *)0x0) {
LAB_001c6431:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->bSaveRawData);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      lVar6 = 0;
LAB_001c6473:
      do {
        pcVar7 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001c64aa;
          if (local_138 != 0x24) goto LAB_001c64b6;
LAB_001c64bb:
          puts("Invalid configuration file.");
        }
        else {
          if (local_138 == 0x25) {
LAB_001c64aa:
            if (pcVar7 == (char *)0x0) goto LAB_001c64bb;
            goto LAB_001c6473;
          }
          if (((local_138 == 0x2f) && (pcVar7 != (char *)0x0)) && (local_137 == '/'))
          goto LAB_001c6473;
LAB_001c64b6:
          if (pcVar7 == (char *)0x0) goto LAB_001c64bb;
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MinPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c6521;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c652d;
          }
          if (local_138 != 0x23) break;
LAB_001c6521:
          if (pcVar7 == (char *)0x0) goto LAB_001c6532;
        }
        if (local_138 == 0x24) goto LAB_001c6532;
LAB_001c652d:
        if (pcVar7 == (char *)0x0) {
LAB_001c6532:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MidPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c6598;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c65a4;
          }
          if (local_138 != 0x23) break;
LAB_001c6598:
          if (pcVar7 == (char *)0x0) goto LAB_001c65a9;
        }
        if (local_138 == 0x24) goto LAB_001c65a9;
LAB_001c65a4:
        if (pcVar7 == (char *)0x0) {
LAB_001c65a9:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MaxPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c660f;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c661b;
          }
          if (local_138 != 0x23) break;
LAB_001c660f:
          if (pcVar7 == (char *)0x0) goto LAB_001c6620;
        }
        if (local_138 == 0x24) goto LAB_001c6620;
LAB_001c661b:
        if (pcVar7 == (char *)0x0) {
LAB_001c6620:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->InitPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c6686;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c6692;
          }
          if (local_138 != 0x23) break;
LAB_001c6686:
          if (pcVar7 == (char *)0x0) goto LAB_001c6697;
        }
        if (local_138 == 0x24) goto LAB_001c6697;
LAB_001c6692:
        if (pcVar7 == (char *)0x0) {
LAB_001c6697:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->ThresholdPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c66fd;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c6709;
          }
          if (local_138 != 0x23) break;
LAB_001c66fd:
          if (pcVar7 == (char *)0x0) goto LAB_001c670e;
        }
        if (local_138 == 0x24) goto LAB_001c670e;
LAB_001c6709:
        if (pcVar7 == (char *)0x0) {
LAB_001c670e:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%lf",pLIRMIA3->CoefPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
            if (local_138 == 0x25) goto LAB_001c6774;
            if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
            goto LAB_001c6780;
          }
          if (local_138 != 0x23) break;
LAB_001c6774:
          if (pcVar7 == (char *)0x0) goto LAB_001c6785;
        }
        if (local_138 == 0x24) goto LAB_001c6785;
LAB_001c6780:
        if (pcVar7 == (char *)0x0) {
LAB_001c6785:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->bProportionalPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c67ff;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c680b;
        }
        if (local_138 != 0x23) break;
LAB_001c67ff:
        if (pcVar7 == (char *)0x0) goto LAB_001c6810;
      }
      if (local_138 == 0x24) goto LAB_001c6810;
LAB_001c680b:
      if (pcVar7 == (char *)0x0) {
LAB_001c6810:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->rightthrusterchan);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c6881;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c688d;
        }
        if (local_138 != 0x23) break;
LAB_001c6881:
        if (pcVar7 == (char *)0x0) goto LAB_001c6892;
      }
      if (local_138 == 0x24) goto LAB_001c6892;
LAB_001c688d:
      if (pcVar7 == (char *)0x0) {
LAB_001c6892:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->leftthrusterchan);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c6903;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c690f;
        }
        if (local_138 != 0x23) break;
LAB_001c6903:
        if (pcVar7 == (char *)0x0) goto LAB_001c6914;
      }
      if (local_138 == 0x24) goto LAB_001c6914;
LAB_001c690f:
      if (pcVar7 == (char *)0x0) {
LAB_001c6914:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->frontthrusterchan);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_001c6985;
          if (((local_138 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c6991;
        }
        if (local_138 != 0x23) break;
LAB_001c6985:
        if (pcVar7 == (char *)0x0) goto LAB_001c6996;
      }
      if (local_138 == 0x24) goto LAB_001c6996;
LAB_001c6991:
      if (pcVar7 == (char *)0x0) {
LAB_001c6996:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->rearthrusterchan);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      iVar5 = fclose(__stream);
      if (iVar5 == 0) goto LAB_001c69e3;
      pcVar7 = "fclose() failed.";
    }
    puts(pcVar7);
  }
LAB_001c69e3:
  if (pLIRMIA3->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pLIRMIA3->threadperiod = 0x32;
  }
  lVar6 = 0x150;
  do {
    uVar2 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + -0x10);
    if (((uVar2 - 0x9c5 < 0xfffff82f) ||
        (uVar3 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar6 * 4), uVar3 - 0x9c5 < 0xfffff82f)
        ) || (uVar4 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x10),
             uVar4 - 0x9c5 < 0xfffff82f)) {
LAB_001c6a56:
      printf("Invalid parameters : channel %d.\n",(ulong)((int)lVar6 - 0x150));
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + -0x10;
      pcVar7[0] = -0x18;
      pcVar7[1] = '\x03';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4;
      pcVar7[0] = -0x24;
      pcVar7[1] = '\x05';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x10;
      pcVar7[0] = -0x30;
      pcVar7[1] = '\a';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x20;
      pcVar7[0] = -0x24;
      pcVar7[1] = '\x05';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x30;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      *(undefined8 *)((long)pLIRMIA3 + lVar6 * 8 + -0x4f0) = 0x3ff0000000000000;
      pcVar7 = (pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x60;
      pcVar7[0] = '\x01';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
    }
    else {
      iVar5 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x20);
      if (iVar5 != 0) {
        if (((uVar3 <= uVar4) && (uVar2 <= uVar3)) &&
           ((iVar5 <= (int)uVar4 && (((int)uVar2 <= iVar5 && (0xfffff82e < iVar5 - 0x9c5U))))))
        goto LAB_001c6aec;
        goto LAB_001c6a56;
      }
      if (uVar4 < uVar3 || uVar3 < uVar2) goto LAB_001c6a56;
LAB_001c6aec:
      if (*(int *)((pLIRMIA3->RS232Port).szDevPath + lVar6 * 4 + 0x30) < 0) goto LAB_001c6a56;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x154);
  if (3 < (uint)pLIRMIA3->rightthrusterchan) {
    puts("Invalid parameter : rightthrusterchan.");
    pLIRMIA3->rightthrusterchan = 1;
  }
  if (3 < (uint)pLIRMIA3->leftthrusterchan) {
    puts("Invalid parameter : leftthrusterchan.");
    pLIRMIA3->leftthrusterchan = 0;
  }
  if (3 < (uint)pLIRMIA3->frontthrusterchan) {
    puts("Invalid parameter : frontthrusterchan.");
    pLIRMIA3->frontthrusterchan = 2;
  }
  if (3 < (uint)pLIRMIA3->rearthrusterchan) {
    puts("Invalid parameter : rearthrusterchan.");
    pLIRMIA3->rearthrusterchan = 3;
  }
  pLIRMIA3->LastPWs[0] = 0;
  pLIRMIA3->LastPWs[1] = 0;
  pLIRMIA3->LastPWs[2] = 0;
  pLIRMIA3->LastPWs[3] = 0;
  iVar5 = OpenRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->szDevPath);
  if (iVar5 != 0) {
    puts("Unable to connect to a LIRMIA3.");
    return 1;
  }
  iVar5 = (pLIRMIA3->RS232Port).DevType;
  if (3 < iVar5 - 1U) {
    if ((iVar5 != 0) ||
       (iVar5 = SetOptionsComputerRS232Port
                          ((pLIRMIA3->RS232Port).hDev,pLIRMIA3->BaudRate,'\0',0,'\b','\0',
                           pLIRMIA3->timeout), iVar5 != 0)) {
      pcVar7 = "Unable to connect to a LIRMIA3.";
      goto LAB_001c6bf6;
    }
    tcflush(*(int *)&(pLIRMIA3->RS232Port).hDev,2);
  }
  iVar5 = InitLIRMIA3(pLIRMIA3);
  if (iVar5 == 0) {
    puts("LIRMIA3 connected.");
    return 0;
  }
  pcVar7 = "Unable to connect to LIRMIA3 : Initialization failure.";
LAB_001c6bf6:
  puts(pcVar7);
  CloseRS232Port(&pLIRMIA3->RS232Port);
  return 1;
}

Assistant:

inline int ConnectLIRMIA3(LIRMIA3* pLIRMIA3, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;

	memset(pLIRMIA3->szCfgFilePath, 0, sizeof(pLIRMIA3->szCfgFilePath));
	sprintf(pLIRMIA3->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pLIRMIA3->szDevPath, 0, sizeof(pLIRMIA3->szDevPath));
		sprintf(pLIRMIA3->szDevPath, "COM1");
		pLIRMIA3->BaudRate = 115200;
		pLIRMIA3->timeout = 1000;
		pLIRMIA3->threadperiod = 50;
		pLIRMIA3->bSaveRawData = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
		{
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
		pLIRMIA3->rightthrusterchan = 3;
		pLIRMIA3->leftthrusterchan = 2;
		pLIRMIA3->frontthrusterchan = 0;
		pLIRMIA3->rearthrusterchan = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pLIRMIA3->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->bSaveRawData) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pLIRMIA3->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->frontthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rearthrusterchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pLIRMIA3->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pLIRMIA3->threadperiod = 50;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (
			(pLIRMIA3->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)
			||(
			(pLIRMIA3->InitPWs[channel] != 0)&&
			((pLIRMIA3->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->InitPWs[channel])||(pLIRMIA3->InitPWs[channel] > pLIRMIA3->MaxPWs[channel]))			
			)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->MidPWs[channel])||(pLIRMIA3->MidPWs[channel] > pLIRMIA3->MaxPWs[channel])||
			(pLIRMIA3->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : channel %d.\n", channel);
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
	}
	if ((pLIRMIA3->rightthrusterchan < 0)||(pLIRMIA3->rightthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pLIRMIA3->rightthrusterchan = 1;
	}
	if ((pLIRMIA3->leftthrusterchan < 0)||(pLIRMIA3->leftthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pLIRMIA3->leftthrusterchan = 0;
	}
	if ((pLIRMIA3->frontthrusterchan < 0)||(pLIRMIA3->frontthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : frontthrusterchan.\n");
		pLIRMIA3->frontthrusterchan = 2;
	}
	if ((pLIRMIA3->rearthrusterchan < 0)||(pLIRMIA3->rearthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rearthrusterchan.\n");
		pLIRMIA3->rearthrusterchan = 3;
	}

	// Used to save raw data, should be handled specifically...
	//pLIRMIA3->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		pLIRMIA3->LastPWs[channel] = 0;
	}

	if (OpenRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pLIRMIA3->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitLIRMIA3(pLIRMIA3) != EXIT_SUCCESS)
	{
		printf("Unable to connect to LIRMIA3 : Initialization failure.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	printf("LIRMIA3 connected.\n");

	return EXIT_SUCCESS;
}